

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtx11extras.cpp
# Opt level: O0

quint32 QX11Info::appUserTime(void)

{
  QCoreApplication *pQVar1;
  QPlatformNativeInterface *pQVar2;
  QScreen *pQVar3;
  long in_FS_OFFSET;
  QScreen *screen;
  QPlatformNativeInterface *native;
  quint32 local_24;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QCoreApplication::instance();
  if (pQVar1 == (QCoreApplication *)0x0) {
    local_24 = 0;
  }
  else {
    QCoreApplication::instance();
    pQVar2 = QGuiApplication::platformNativeInterface();
    if (pQVar2 == (QPlatformNativeInterface *)0x0) {
      local_24 = 0;
    }
    else {
      pQVar3 = QGuiApplication::primaryScreen();
      QByteArray::QByteArray(&local_20,"appusertime",-1);
      local_24 = (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2,&local_20,pQVar3);
      QByteArray::~QByteArray((QByteArray *)0xada14b);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

quint32 QX11Info::appUserTime()
{
    if (!qApp)
        return 0;
    QPlatformNativeInterface *native = qApp->platformNativeInterface();
    if (!native)
        return 0;
    QScreen* screen = QGuiApplication::primaryScreen();
    return static_cast<xcb_timestamp_t>(reinterpret_cast<quintptr>(native->nativeResourceForScreen("appusertime", screen)));
}